

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_pubkey.cc
# Opt level: O0

int X509_PUBKEY_set0_param
              (X509_PUBKEY *pub,ASN1_OBJECT *aobj,int ptype,void *pval,uchar *penc,int penclen)

{
  int iVar1;
  int key_len_local;
  uint8_t *key_local;
  void *param_value_local;
  int param_type_local;
  ASN1_OBJECT *obj_local;
  X509_PUBKEY *pub_local;
  
  iVar1 = X509_ALGOR_set0(pub->algor,aobj,ptype,pval);
  if (iVar1 != 0) {
    ASN1_STRING_set0(pub->public_key,penc,penclen);
    pub->public_key->flags = pub->public_key->flags & 0xfffffffffffffff0;
    pub->public_key->flags = pub->public_key->flags | 8;
    x509_pubkey_changed((X509_PUBKEY *)pub);
  }
  pub_local._4_4_ = (uint)(iVar1 != 0);
  return pub_local._4_4_;
}

Assistant:

int X509_PUBKEY_set0_param(X509_PUBKEY *pub, ASN1_OBJECT *obj, int param_type,
                           void *param_value, uint8_t *key, int key_len) {
  if (!X509_ALGOR_set0(pub->algor, obj, param_type, param_value)) {
    return 0;
  }

  ASN1_STRING_set0(pub->public_key, key, key_len);
  // Set the number of unused bits to zero.
  pub->public_key->flags &= ~(ASN1_STRING_FLAG_BITS_LEFT | 0x07);
  pub->public_key->flags |= ASN1_STRING_FLAG_BITS_LEFT;

  x509_pubkey_changed(pub);
  return 1;
}